

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

int64_t __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::GetVariablesToIntegers
          (BinaryPolynomialModel<unsigned_int,_double> *this,uint *index)

{
  uint *puVar1;
  const_iterator cVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  int64_t iVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sorted_variables;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  cVar2 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)this,index);
  if (cVar2.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    iVar6 = -1;
  }
  else {
    GetSortedVariables(&local_30,this);
    uVar3 = (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    puVar5 = local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (long)uVar3) {
      do {
        uVar4 = uVar3 >> 1;
        uVar3 = ~uVar4 + uVar3;
        puVar1 = puVar5 + uVar4 + 1;
        if (*index <= puVar5[uVar4]) {
          uVar3 = uVar4;
          puVar1 = puVar5;
        }
        puVar5 = puVar1;
      } while (0 < (long)uVar3);
    }
    if (local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar6 = (long)puVar5 -
            (long)local_30.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
  }
  return iVar6;
}

Assistant:

int64_t GetVariablesToIntegers( const IndexType &index ) const {
      if ( variables_.count( index ) == 0 ) {
        return -1;
      } else {
        std::vector<IndexType> sorted_variables = GetSortedVariables();
        return std::distance(
            sorted_variables.begin(), std::lower_bound( sorted_variables.begin(), sorted_variables.end(), index ) );
      }
    }